

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboCompletenessTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles2::Functional::SupportedCombinationTest::tryCombination
          (SupportedCombinationTest *this,FormatCombination *comb)

{
  size_t *this_00;
  deUint32 fbo_00;
  GLenum GVar1;
  RenderContext *context;
  Functions *pFVar2;
  GLenum glStatus;
  undefined1 local_100 [8];
  FboBuilder builder;
  Framebuffer fbo;
  FormatCombination *comb_local;
  SupportedCombinationTest *this_local;
  
  context = deqp::gls::fboc::details::Context::getRenderContext((this->super_TestBase).m_ctx);
  this_00 = &builder.m_configs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)this_00,context);
  fbo_00 = glu::ObjectWrapper::operator*((ObjectWrapper *)this_00);
  pFVar2 = deqp::gls::fboc::details::gl(&this->super_TestBase);
  deqp::gls::FboUtil::FboBuilder::FboBuilder((FboBuilder *)local_100,fbo_00,0x8d40,pFVar2);
  deqp::gls::fboc::details::TestBase::attachTargetToNew
            (&this->super_TestBase,0x8ce0,comb->colorKind,comb->colorFmt,0x40,0x40,
             (FboBuilder *)local_100);
  deqp::gls::fboc::details::TestBase::attachTargetToNew
            (&this->super_TestBase,0x8d00,comb->depthKind,comb->depthFmt,0x40,0x40,
             (FboBuilder *)local_100);
  deqp::gls::fboc::details::TestBase::attachTargetToNew
            (&this->super_TestBase,0x8d20,comb->stencilKind,comb->stencilFmt,0x40,0x40,
             (FboBuilder *)local_100);
  pFVar2 = deqp::gls::fboc::details::gl(&this->super_TestBase);
  GVar1 = (*pFVar2->checkFramebufferStatus)(0x8d40);
  deqp::gls::FboUtil::FboBuilder::~FboBuilder((FboBuilder *)local_100);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)
             &builder.m_configs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return GVar1 == 0x8cd5;
}

Assistant:

bool SupportedCombinationTest::tryCombination (const FormatCombination& comb)
{
	glu::Framebuffer fbo(m_ctx.getRenderContext());
	FboBuilder builder(*fbo, GL_FRAMEBUFFER, fboc::gl(*this));

	attachTargetToNew(GL_COLOR_ATTACHMENT0,		comb.colorKind,		comb.colorFmt,
					  64,						64,					builder);
	attachTargetToNew(GL_DEPTH_ATTACHMENT,		comb.depthKind,		comb.depthFmt,
					  64,						64,					builder);
	attachTargetToNew(GL_STENCIL_ATTACHMENT,	comb.stencilKind,	comb.stencilFmt,
					  64,						64,					builder);

	const GLenum glStatus = fboc::gl(*this).checkFramebufferStatus(GL_FRAMEBUFFER);

	return (glStatus == GL_FRAMEBUFFER_COMPLETE);
}